

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

RawHeadersList *
QNetworkHeadersPrivate::fromHttpToRaw(RawHeadersList *__return_storage_ptr__,QHttpHeaders *headers)

{
  long lVar1;
  longlong lVar2;
  char *pcVar3;
  QByteArrayView a;
  bool bVar4;
  qsizetype qVar5;
  Data<QHashPrivate::Node<QByteArray,_long_long>_> *pDVar6;
  pointer ppVar7;
  longlong *plVar8;
  ulong uVar9;
  long i;
  uint uVar10;
  long in_FS_OFFSET;
  QLatin1StringView QVar11;
  iterator iVar12;
  RawHeadersList *list;
  QByteArrayView local_90;
  QLatin1StringView local_78;
  undefined1 *local_68;
  QByteArrayView local_58;
  QHash<QByteArray,_long_long> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QHttpHeaders::isEmpty(headers);
  if (bVar4) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00193402:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (pair<QByteArray,_QByteArray> *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (pair<QByteArray,_QByteArray> *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_40.d = (Data *)0x0;
    qVar5 = QHttpHeaders::size(headers);
    QList<std::pair<QByteArray,_QByteArray>_>::reserve(__return_storage_ptr__,qVar5);
    qVar5 = QHttpHeaders::size(headers);
    QHash<QByteArray,_long_long>::reserve(&local_40,qVar5);
    i = 0;
    while( true ) {
      qVar5 = QHttpHeaders::size(headers);
      if (qVar5 <= i) break;
      QVar11 = QHttpHeaders::nameAt(headers,i);
      local_58.m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_58.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = QHttpHeaders::valueAt(headers,i);
      local_78 = QVar11;
      local_90 = QHttpHeaders::wellKnownHeaderName(SetCookie);
      bVar4 = comparesEqual((QByteArrayView *)&local_78,&local_90);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78.m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_78.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)&local_78,QVar11.m_data,QVar11.m_size);
      iVar12 = QHash<QByteArray,_long_long>::findImpl<QByteArray>(&local_40,(QByteArray *)&local_78)
      ;
      pDVar6 = iVar12.i.d;
      if (pDVar6 == (Data<QHashPrivate::Node<QByteArray,_long_long>_> *)0x0 && iVar12.i.bucket == 0)
      {
        lVar2 = (__return_storage_ptr__->d).size;
        plVar8 = QHash<QByteArray,_long_long>::operator[](&local_40,(QByteArray *)&local_78);
        *plVar8 = lVar2;
        QByteArrayView::toByteArray((QByteArray *)&local_90,&local_58);
        QList<std::pair<QByteArray,QByteArray>>::emplaceBack<QByteArray_const&,QByteArray>
                  ((QList<std::pair<QByteArray,QByteArray>> *)__return_storage_ptr__,
                   (QByteArray *)&local_78,(QByteArray *)&local_90);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
      }
      else {
        pcVar3 = "\", ";
        if (bVar4) {
          pcVar3 = "\n\n";
        }
        uVar9 = iVar12.i.bucket >> 7;
        uVar10 = (uint)iVar12.i.bucket & 0x7f;
        lVar1 = *(long *)(pDVar6->spans[uVar9].entries[pDVar6->spans[uVar9].offsets[uVar10]].storage
                          .data + 0x18);
        ppVar7 = QList<std::pair<QByteArray,_QByteArray>_>::data(__return_storage_ptr__);
        QByteArray::append(&ppVar7[lVar1].second,pcVar3 + 1);
        a = local_58;
        lVar1 = *(long *)(pDVar6->spans[uVar9].entries[pDVar6->spans[uVar9].offsets[uVar10]].storage
                          .data + 0x18);
        ppVar7 = QList<std::pair<QByteArray,_QByteArray>_>::data(__return_storage_ptr__);
        QByteArray::append(&ppVar7[lVar1].second,a);
      }
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
      i = i + 1;
    }
    QHash<QByteArray,_long_long>::~QHash(&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00193402;
  }
  return __return_storage_ptr__;
}

Assistant:

QNetworkHeadersPrivate::RawHeadersList QNetworkHeadersPrivate::fromHttpToRaw(
        const QHttpHeaders &headers)
{
    if (headers.isEmpty())
        return {};

    QNetworkHeadersPrivate::RawHeadersList list;
    QHash<QByteArray, qsizetype> nameToIndex;
    list.reserve(headers.size());
    nameToIndex.reserve(headers.size());

    for (qsizetype i = 0; i < headers.size(); ++i) {
        const auto nameL1 = headers.nameAt(i);
        const auto value = headers.valueAt(i);

        const bool isSetCookie = nameL1 == QHttpHeaders::wellKnownHeaderName(
                                         QHttpHeaders::WellKnownHeader::SetCookie);

        const auto name = QByteArray(nameL1.data(), nameL1.size());
        if (auto it = nameToIndex.find(name); it != nameToIndex.end()) {
            list[it.value()].second += isSetCookie ? "\n" : ", ";
            list[it.value()].second += value;
        } else {
            nameToIndex[name] = list.size();
            list.emplaceBack(name, value.toByteArray());
        }
    }

    return list;
}